

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O3

PhysicalDeviceDetails * get_physical_device_details(VkPhysicalDevice physicalDevice)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if ((long)mock.physical_device_handles.
            super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)mock.physical_device_handles.
            super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    lVar1 = (long)mock.physical_device_handles.
                  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)mock.physical_device_handles.
                  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar2 = 0;
    lVar3 = 0;
    do {
      if (mock.physical_device_handles.
          super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] == physicalDevice) {
        return (PhysicalDeviceDetails *)
               ((long)mock.physical_devices_details.
                      super__Vector_base<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
                      ._M_impl.super__Vector_impl_data._M_start - lVar2);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + -0x698;
    } while (lVar1 + (ulong)(lVar1 == 0) != lVar3);
  }
  __assert_fail("false && \"should never reach here!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/tests/vulkan_mock.cpp"
                ,0x72,
                "VulkanMock::PhysicalDeviceDetails &get_physical_device_details(VkPhysicalDevice)");
}

Assistant:

VulkanMock::PhysicalDeviceDetails& get_physical_device_details(VkPhysicalDevice physicalDevice) {
    for (size_t i = 0; i < mock.physical_device_handles.size(); i++) {
        if (mock.physical_device_handles[i] == physicalDevice) return mock.physical_devices_details[i];
    }
    assert(false && "should never reach here!");
    return mock.physical_devices_details.front();
}